

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack20_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0xfffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x14;
  out[1] = (uVar1 >> 0x14) + base + (in[1] & 0xff) * 0x1000;
  out[2] = (in[1] >> 8 & 0xfffff) + base;
  uVar1 = in[1];
  out[3] = uVar1 >> 0x1c;
  out[3] = (uVar1 >> 0x1c) + base + (in[2] & 0xffff) * 0x10;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x10;
  out[4] = (uVar1 >> 0x10) + base + (in[3] & 0xf) * 0x10000;
  out[5] = (in[3] >> 4 & 0xfffff) + base;
  uVar1 = in[3];
  out[6] = uVar1 >> 0x18;
  out[6] = (uVar1 >> 0x18) + base + (in[4] & 0xfff) * 0x100;
  out[7] = (in[4] >> 0xc) + base;
  out[8] = (in[5] & 0xfffff) + base;
  uVar1 = in[5];
  out[9] = uVar1 >> 0x14;
  out[9] = (uVar1 >> 0x14) + base + (in[6] & 0xff) * 0x1000;
  out[10] = (in[6] >> 8 & 0xfffff) + base;
  uVar1 = in[6];
  out[0xb] = uVar1 >> 0x1c;
  out[0xb] = (uVar1 >> 0x1c) + base + (in[7] & 0xffff) * 0x10;
  uVar1 = in[7];
  out[0xc] = uVar1 >> 0x10;
  out[0xc] = (uVar1 >> 0x10) + base + (in[8] & 0xf) * 0x10000;
  out[0xd] = (in[8] >> 4 & 0xfffff) + base;
  uVar1 = in[8];
  out[0xe] = uVar1 >> 0x18;
  out[0xe] = (uVar1 >> 0x18) + base + (in[9] & 0xfff) * 0x100;
  out[0xf] = (in[9] >> 0xc) + base;
  out[0x10] = (in[10] & 0xfffff) + base;
  uVar1 = in[10];
  out[0x11] = uVar1 >> 0x14;
  out[0x11] = (uVar1 >> 0x14) + base + (in[0xb] & 0xff) * 0x1000;
  out[0x12] = (in[0xb] >> 8 & 0xfffff) + base;
  uVar1 = in[0xb];
  out[0x13] = uVar1 >> 0x1c;
  out[0x13] = (uVar1 >> 0x1c) + base + (in[0xc] & 0xffff) * 0x10;
  uVar1 = in[0xc];
  out[0x14] = uVar1 >> 0x10;
  out[0x14] = (uVar1 >> 0x10) + base + (in[0xd] & 0xf) * 0x10000;
  out[0x15] = (in[0xd] >> 4 & 0xfffff) + base;
  uVar1 = in[0xd];
  out[0x16] = uVar1 >> 0x18;
  out[0x16] = (uVar1 >> 0x18) + base + (in[0xe] & 0xfff) * 0x100;
  out[0x17] = (in[0xe] >> 0xc) + base;
  out[0x18] = (in[0xf] & 0xfffff) + base;
  uVar1 = in[0xf];
  out[0x19] = uVar1 >> 0x14;
  out[0x19] = (uVar1 >> 0x14) + base + (in[0x10] & 0xff) * 0x1000;
  out[0x1a] = (in[0x10] >> 8 & 0xfffff) + base;
  uVar1 = in[0x10];
  out[0x1b] = uVar1 >> 0x1c;
  out[0x1b] = (uVar1 >> 0x1c) + base + (in[0x11] & 0xffff) * 0x10;
  uVar1 = in[0x11];
  out[0x1c] = uVar1 >> 0x10;
  out[0x1c] = (uVar1 >> 0x10) + base + (in[0x12] & 0xf) * 0x10000;
  out[0x1d] = (in[0x12] >> 4 & 0xfffff) + base;
  uVar1 = in[0x12];
  out[0x1e] = uVar1 >> 0x18;
  out[0x1e] = (uVar1 >> 0x18) + base + (in[0x13] & 0xfff) * 0x100;
  out[0x1f] = (in[0x13] >> 0xc) + base;
  return in + 0x14;
}

Assistant:

uint32_t * unpack20_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}